

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

LogicalType * __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::LogicalType>
          (LogicalType *__return_storage_ptr__,Deserializer *this,field_id_t field_id,char *tag,
          LogicalType *default_value)

{
  int iVar1;
  undefined6 in_register_00000012;
  
  iVar1 = (*this->_vptr_Deserializer[4])
                    (this,CONCAT62(in_register_00000012,field_id) & 0xffffffff,tag);
  if ((char)iVar1 == '\0') {
    (*this->_vptr_Deserializer[5])(this,0);
    LogicalType::LogicalType(__return_storage_ptr__,default_value);
  }
  else {
    Read<duckdb::LogicalType>(__return_storage_ptr__,this);
    (*this->_vptr_Deserializer[5])(this,1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}